

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall InterCode::InterCode(InterCode *this,int k,Operand *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->kind = k;
  (this->target).kind = t->kind;
  paVar1 = &(this->target).value.field_2;
  (this->target).value._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (t->value)._M_dataplus._M_p;
  paVar2 = &(t->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(t->value).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->target).value.field_2 + 8) = uVar4;
  }
  else {
    (this->target).value._M_dataplus._M_p = pcVar3;
    (this->target).value.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->target).value._M_string_length = (t->value)._M_string_length;
  (t->value)._M_dataplus._M_p = (pointer)paVar2;
  (t->value)._M_string_length = 0;
  (t->value).field_2._M_local_buf[0] = '\0';
  (this->target).active = t->active;
  (this->arg1).kind = 0;
  (this->arg1).value._M_dataplus._M_p = (pointer)&(this->arg1).value.field_2;
  (this->arg1).value._M_string_length = 0;
  (this->arg1).value.field_2._M_local_buf[0] = '\0';
  (this->arg1).active = -1;
  (this->arg2).kind = 0;
  (this->arg2).value._M_dataplus._M_p = (pointer)&(this->arg2).value.field_2;
  (this->arg2).value._M_string_length = 0;
  (this->arg2).value.field_2._M_local_buf[0] = '\0';
  (this->arg2).active = -1;
  return;
}

Assistant:

InterCode(int k, Operand t): kind(k), target(move(t)) {}